

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

int scalar_doclick(t_word *data,t_template *template,t_scalar *sc,_array *ap,_glist *owner,
                  t_float xloc,t_float yloc,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  int iVar1;
  _glist *p_Var2;
  t_symbol *ptVar3;
  _parentwidgetbehavior *p_Var4;
  t_float tVar5;
  t_float tVar6;
  _parentwidgetbehavior *wb;
  t_float basey;
  t_float basex;
  t_atom at [3];
  t_gobj *y;
  _glist *templatecanvas;
  int hit;
  int xpix_local;
  t_float yloc_local;
  t_float xloc_local;
  _glist *owner_local;
  _array *ap_local;
  t_scalar *sc_local;
  t_template *template_local;
  t_word *data_local;
  
  p_Var2 = template_findcanvas(template);
  ptVar3 = gensym("x");
  tVar5 = template_getfloat(template,ptVar3,data,0);
  ptVar3 = gensym("y");
  tVar6 = template_getfloat(template,ptVar3,data,0);
  basey = 1.4013e-45;
  at[0].a_type = A_NULL;
  at[0].a_w.w_float = 1.4013e-45;
  at[1].a_type = (t_atomtype)(tVar5 + xloc);
  at[1].a_w.w_float = 1.4013e-45;
  at[2].a_type = (t_atomtype)(tVar6 + yloc);
  if (doit != 0) {
    ptVar3 = gensym("click");
    template_notifyforscalar(template,owner,sc,ptVar3,3,(t_atom *)&basey);
  }
  at[2].a_w = (word)p_Var2->gl_list;
  while( true ) {
    if (at[2].a_w.w_symbol == (t_symbol *)0x0) {
      return 0;
    }
    p_Var4 = pd_getparentwidget((t_pd *)at[2].a_w.w_symbol);
    if ((p_Var4 != (_parentwidgetbehavior *)0x0) &&
       (iVar1 = (*p_Var4->w_parentclickfn)
                          (at[2].a_w,owner,data,template,sc,ap,tVar5 + xloc,tVar6 + yloc,xpix,ypix,
                           shift,alt,dbl,doit), iVar1 != 0)) break;
    at[2].a_w = (word)(at[2].a_w.w_symbol)->s_thing;
  }
  return iVar1;
}

Assistant:

int scalar_doclick(t_word *data, t_template *template, t_scalar *sc,
    t_array *ap, struct _glist *owner,
    t_float xloc, t_float yloc, int xpix, int ypix,
    int shift, int alt, int dbl, int doit)
{
    int hit = 0;
    t_canvas *templatecanvas = template_findcanvas(template);
    t_gobj *y;
    t_atom at[3];
    t_float basex = template_getfloat(template, gensym("x"), data, 0);
    t_float basey = template_getfloat(template, gensym("y"), data, 0);
    SETFLOAT(at, 0); /* unused - this is later bashed to the gpointer */
    SETFLOAT(at+1, basex + xloc);
    SETFLOAT(at+2, basey + yloc);
    if (doit)
        template_notifyforscalar(template, owner,
            sc, gensym("click"), 3, at);
    for (y = templatecanvas->gl_list; y; y = y->g_next)
    {
        const t_parentwidgetbehavior *wb = pd_getparentwidget(&y->g_pd);
        if (!wb) continue;
        if ((hit = (*wb->w_parentclickfn)(y, owner,
            data, template, sc, ap, basex + xloc, basey + yloc,
            xpix, ypix, shift, alt, dbl, doit)))
                return (hit);
    }
    return (0);
}